

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  size_t *psVar1;
  ITransientExpression *pIVar2;
  IStreamingReporter *pIVar3;
  AssertionResultData tempResult;
  SectionInfo testCaseSection;
  AssertionResult result;
  Counts assertions;
  SectionStats testCaseSectionStats;
  Totals deltaTotals;
  string local_3a0;
  string local_380;
  AssertionResultData local_360;
  SectionInfo local_308;
  undefined1 local_2b8 [304];
  AssertionResult local_188;
  Counts local_f8;
  SectionStats local_e0;
  Totals local_60;
  
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0x10])();
  LazyExpression::LazyExpression((LazyExpression *)local_2b8,false);
  AssertionResultData::AssertionResultData
            (&local_360,FatalErrorCondition,(LazyExpression *)local_2b8);
  pIVar2 = (ITransientExpression *)(local_2b8 + 0x10);
  local_2b8._0_8_ = pIVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b8,message.m_start,message.m_start + message.m_size);
  std::__cxx11::string::operator=((string *)&local_360,(string *)local_2b8);
  if ((ITransientExpression *)local_2b8._0_8_ != pIVar2) {
    operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
  }
  AssertionResult::AssertionResult(&local_188,&this->m_lastAssertionInfo,&local_360);
  assertionEnded(this,&local_188);
  handleUnfinishedSections(this);
  SectionInfo::SectionInfo
            (&local_308,&(this->m_activeTestCase->super_TestCaseInfo).lineInfo,
             (string *)this->m_activeTestCase);
  local_f8.passed = 0;
  local_f8.failedButOk = 0;
  local_f8.failed = 1;
  SectionStats::SectionStats(&local_e0,&local_308,&local_f8,0.0,false);
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar3->_vptr_IStreamingReporter[0xb])(pIVar3,&local_e0);
  local_60.error = 0;
  local_60.testCases.failedButOk = 0;
  local_60.assertions.passed = 0;
  local_60.assertions.failedButOk = 0;
  local_60.testCases.passed = 0;
  local_60.testCases.failed = 1;
  local_60.assertions.failed = 1;
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_380._M_string_length = 0;
  local_380.field_2._M_local_buf[0] = '\0';
  local_3a0._M_string_length = 0;
  local_3a0.field_2._M_local_buf[0] = '\0';
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_2b8,&this->m_activeTestCase->super_TestCaseInfo,&local_60,
             &local_380,&local_3a0,false);
  (*pIVar3->_vptr_IStreamingReporter[0xc])(pIVar3,local_2b8);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,
                    CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                             local_3a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,
                    CONCAT71(local_380.field_2._M_allocated_capacity._1_7_,
                             local_380.field_2._M_local_buf[0]) + 1);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8[0x10] = '\0';
  local_2b8._0_8_ = pIVar2;
  testGroupEnded(this,(string *)local_2b8,&this->m_totals,1,1);
  if ((ITransientExpression *)local_2b8._0_8_ != pIVar2) {
    operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
  }
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  TestRunStats::TestRunStats((TestRunStats *)local_2b8,&this->m_runInfo,&this->m_totals,false);
  (*pIVar3->_vptr_IStreamingReporter[0xe])(pIVar3,local_2b8);
  TestRunStats::~TestRunStats((TestRunStats *)local_2b8);
  SectionStats::~SectionStats(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.description._M_dataplus._M_p != &local_308.description.field_2) {
    operator_delete(local_308.description._M_dataplus._M_p,
                    local_308.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.name._M_dataplus._M_p != &local_308.name.field_2) {
    operator_delete(local_308.name._M_dataplus._M_p,local_308.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_188.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_188.m_resultData.reconstructedExpression._M_dataplus._M_p,
                    local_188.m_resultData.reconstructedExpression.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.m_resultData.message._M_dataplus._M_p != &local_188.m_resultData.message.field_2)
  {
    operator_delete(local_188.m_resultData.message._M_dataplus._M_p,
                    local_188.m_resultData.message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.reconstructedExpression._M_dataplus._M_p !=
      &local_360.reconstructedExpression.field_2) {
    operator_delete(local_360.reconstructedExpression._M_dataplus._M_p,
                    local_360.reconstructedExpression.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.message._M_dataplus._M_p != &local_360.message.field_2) {
    operator_delete(local_360.message._M_dataplus._M_p,
                    local_360.message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition( StringRef message ) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult( ResultWas::FatalErrorCondition, { false } );
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  std::string(),
                                  std::string(),
                                  false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }